

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

void __thiscall
google::protobuf::io::CodedOutputStream::WriteVarint64(CodedOutputStream *this,uint64 value)

{
  byte *pbVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint8 bytes [10];
  
  if (this->buffer_size_ < 10) {
    lVar2 = 0;
    for (; 0x7f < value; value = value >> 7) {
      bytes[lVar2] = (byte)value | 0x80;
      lVar2 = lVar2 + 1;
    }
    bytes[lVar2] = (byte)value;
    WriteRaw(this,bytes,(int)lVar2 + 1);
    return;
  }
  pbVar1 = this->buffer_;
  uVar4 = (uint)value;
  if (value >> 0x38 == 0) {
    uVar3 = (uint)(value >> 0x1c);
    if (uVar3 != 0) {
      if (0x3fff < uVar3) {
        if (0x1fffff < uVar3) {
          bytes[2] = '\b';
          bytes[3] = '\0';
          bytes[4] = '\0';
          bytes[5] = '\0';
          bytes[6] = '\0';
          bytes[7] = '\0';
          bytes[8] = '\0';
          bytes[9] = '\0';
          goto LAB_001200cf;
        }
        bytes[2] = '\a';
        bytes[3] = '\0';
        bytes[4] = '\0';
        bytes[5] = '\0';
        bytes[6] = '\0';
        bytes[7] = '\0';
        bytes[8] = '\0';
        bytes[9] = '\0';
        goto LAB_001200de;
      }
      if (0x7f < uVar3) {
        bytes[2] = '\x06';
        bytes[3] = '\0';
        bytes[4] = '\0';
        bytes[5] = '\0';
        bytes[6] = '\0';
        bytes[7] = '\0';
        bytes[8] = '\0';
        bytes[9] = '\0';
        goto LAB_001200ed;
      }
      bytes._2_8_ = 5;
      goto LAB_001200fc;
    }
    if (0x3fff < uVar4) {
      if (0x1fffff < uVar4) {
        bytes[2] = '\x04';
        bytes[3] = '\0';
        bytes[4] = '\0';
        bytes[5] = '\0';
        bytes[6] = '\0';
        bytes[7] = '\0';
        bytes[8] = '\0';
        bytes[9] = '\0';
        goto LAB_00120102;
      }
      bytes[2] = '\x03';
      bytes[3] = '\0';
      bytes[4] = '\0';
      bytes[5] = '\0';
      bytes[6] = '\0';
      bytes[7] = '\0';
      bytes[8] = '\0';
      bytes[9] = '\0';
      goto LAB_0012010d;
    }
    if (uVar4 < 0x80) {
      bytes._2_8_ = 1;
      goto LAB_00120123;
    }
    bytes[2] = '\x02';
    bytes[3] = '\0';
    bytes[4] = '\0';
    bytes[5] = '\0';
    bytes[6] = '\0';
    bytes[7] = '\0';
    bytes[8] = '\0';
    bytes[9] = '\0';
  }
  else {
    if ((long)value < 0) {
      pbVar1[9] = 0x81;
      bytes[2] = '\n';
      bytes[3] = '\0';
      bytes[4] = '\0';
      bytes[5] = '\0';
      bytes[6] = '\0';
      bytes[7] = '\0';
      bytes[8] = '\0';
      bytes[9] = '\0';
    }
    else {
      bytes[2] = '\t';
      bytes[3] = '\0';
      bytes[4] = '\0';
      bytes[5] = '\0';
      bytes[6] = '\0';
      bytes[7] = '\0';
      bytes[8] = '\0';
      bytes[9] = '\0';
    }
    pbVar1[8] = (byte)(value >> 0x38) | 0x80;
LAB_001200cf:
    pbVar1[7] = (byte)(value >> 0x31) | 0x80;
LAB_001200de:
    pbVar1[6] = (byte)(value >> 0x2a) | 0x80;
LAB_001200ed:
    pbVar1[5] = (byte)(value >> 0x23) | 0x80;
LAB_001200fc:
    pbVar1[4] = (byte)(value >> 0x1c) | 0x80;
LAB_00120102:
    pbVar1[3] = (byte)(value >> 0x15) | 0x80;
LAB_0012010d:
    pbVar1[2] = (byte)(value >> 0xe) | 0x80;
  }
  pbVar1[1] = (byte)(value >> 7) | 0x80;
LAB_00120123:
  *pbVar1 = (byte)value | 0x80;
  pbVar1[bytes._2_8_ + -1] = pbVar1[bytes._2_8_ + -1] & 0x7f;
  this->buffer_ = this->buffer_ + bytes._2_8_;
  this->buffer_size_ = this->buffer_size_ - (int)bytes._2_8_;
  return;
}

Assistant:

void CodedOutputStream::WriteVarint64(uint64 value) {
  if (buffer_size_ >= kMaxVarintBytes) {
    // Fast path:  We have enough bytes left in the buffer to guarantee that
    // this write won't cross the end, so we can skip the checks.
    uint8* target = buffer_;

    uint8* end = WriteVarint64ToArrayInline(value, target);
    int size = end - target;
    Advance(size);
  } else {
    // Slow path:  This write might cross the end of the buffer, so we
    // compose the bytes first then use WriteRaw().
    uint8 bytes[kMaxVarintBytes];
    int size = 0;
    while (value > 0x7F) {
      bytes[size++] = (static_cast<uint8>(value) & 0x7F) | 0x80;
      value >>= 7;
    }
    bytes[size++] = static_cast<uint8>(value) & 0x7F;
    WriteRaw(bytes, size);
  }
}